

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

void __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::add
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *key
          ,ByteArray<2UL> *value)

{
  int iVar1;
  pointer pKVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  unsigned_long uVar4;
  undefined4 extraout_var_00;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double notSortedPart;
  unsigned_long totalStorageSize;
  unsigned_long notSortedStorageSize;
  Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *in_stack_00000060;
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
  *in_stack_ffffffffffffff80;
  ByteArray<2UL> *in_stack_ffffffffffffffb0;
  Key<2UL> *in_stack_ffffffffffffffb8;
  unsigned_long local_38 [3];
  undefined1 local_20 [16];
  undefined8 local_10;
  
  local_10 = in_RSI;
  pKVar2 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                         *)0x2b16ff);
  std::
  make_unique<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<2ul>>,supermap::Key<2ul>const&,supermap::ByteArray<2ul>&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  (**(pKVar2->
     super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
     ).
     super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
     ._vptr_OrderedStorage)(pKVar2,local_20);
  std::
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>_>
  ::~unique_ptr((unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>_>
                 *)in_stack_ffffffffffffff80);
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x2b1749);
  std::
  unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                *)0x2b1766);
  local_38[0] = OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                ::getLastElementIndex(in_stack_ffffffffffffff80);
  (**(pEVar3->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
     _vptr_KeyValueStorage)(pEVar3,local_10,local_38);
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x2b1795);
  iVar1 = (*(pEVar3->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[3])();
  if (*(ulong *)(in_RDI + 0x80) <= CONCAT44(extraout_var,iVar1)) {
    dropRamIndexToDisk(in_stack_00000060);
  }
  std::
  unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                *)0x2b17e8);
  uVar4 = KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
          ::getNotSortedItemsCount
                    ((KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                      *)0x2b17f0);
  pKVar2 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                         *)0x2b17ff);
  iVar1 = (*(pKVar2->
            super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
            ).
            super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
            ._vptr_OrderedStorage[1])();
  auVar6._4_4_ = extraout_var_00;
  auVar6._0_4_ = iVar1;
  auVar5._8_4_ = (int)(uVar4 >> 0x20);
  auVar5._0_8_ = uVar4;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = extraout_var_00;
  auVar6._12_4_ = 0x45300000;
  if (*(double *)(in_RDI + 0x1430) <=
      ((auVar5._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
      ((auVar6._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0))) {
    dropRamIndexToDisk(in_stack_00000060);
    shrinkDataStorage((Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *)value
                     );
  }
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        diskDataStorage_->append(std::make_unique<KeyVal>(key, value));
        innerStorage_->add(key, diskDataStorage_->getLastElementIndex());
        if (innerStorage_->getUpperSizeBound() >= keyIndexBatchSize_) {
            dropRamIndexToDisk();
        }

        IndexT notSortedStorageSize = diskDataStorage_->getNotSortedItemsCount();
        IndexT totalStorageSize = diskDataStorage_->getItemsCount();

        double notSortedPart = static_cast<double>(notSortedStorageSize) / static_cast<double>(totalStorageSize);

        if (notSortedPart >= maxNotSortedPart_) {
            dropRamIndexToDisk();
            shrinkDataStorage();
        }
    }